

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

void __thiscall DROPlayer::GenerateDeviceConfig(DROPlayer *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 *puVar1;
  pointer p_Var2;
  pointer puVar3;
  char *pcVar4;
  undefined4 uVar5;
  ulong uVar6;
  long lVar7;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char chipNameFull [16];
  
  p_Var2 = (this->_devCfgs).
           super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devCfgs).
      super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var2) {
    (this->_devCfgs).
    super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>._M_impl.
    super__Vector_impl_data._M_finish = p_Var2;
  }
  std::vector<_device_generic_config,_std::allocator<_device_generic_config>_>::resize
            (&this->_devCfgs,
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  this_00 = &this->_devNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  lVar7 = 8;
  for (uVar6 = 0;
      p_Var2 = (this->_devCfgs).
               super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->_devCfgs).
                            super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var2 >> 4);
      uVar6 = uVar6 + 1) {
    puVar1 = (undefined8 *)((long)p_Var2 + lVar7 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&p_Var2->emuCore + lVar7) = 0x369e99;
    puVar3 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0xda7a64;
    if (puVar3[uVar6] != '\f') {
      uVar5 = 0x369e99;
    }
    *(undefined4 *)((long)&p_Var2->emuCore + lVar7) = uVar5;
    *(undefined1 *)((long)p_Var2 + lVar7 + -3) = 0;
    pcVar4 = "OPL3";
    if (puVar3[uVar6] != '\f') {
      pcVar4 = "OPL2";
    }
    if ((ulong)((long)(this->_devCfgs).
                      super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_devCfgs).
                     super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
      std::__cxx11::string::string((string *)&local_68,pcVar4,&local_69);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_68);
    }
    else {
      snprintf(chipNameFull,0x10,"%s #%u",pcVar4,(ulong)((int)uVar6 + 1));
      std::__cxx11::string::string((string *)&local_68,chipNameFull,&local_69);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_68);
    }
    std::__cxx11::string::~string((string *)&local_68);
    lVar7 = lVar7 + 0x10;
  }
  return;
}

Assistant:

void DROPlayer::GenerateDeviceConfig(void)
{
	size_t curDev;
	const char* chipName;
	char chipNameFull[0x10];
	
	_devCfgs.clear();
	_devCfgs.resize(_devTypes.size());
	_devNames.clear();
	for (curDev = 0; curDev < _devCfgs.size(); curDev ++)
	{
		DEV_GEN_CFG* devCfg = &_devCfgs[curDev];
		memset(devCfg, 0x00, sizeof(DEV_GEN_CFG));
		
		devCfg->clock = 3579545;
		if (_devTypes[curDev] == DEVID_YMF262)
			devCfg->clock *= 4;	// OPL3 uses a 14 MHz clock
		devCfg->flags = 0x00;
		
		chipName = (_devTypes[curDev] == DEVID_YMF262) ? "OPL3" : "OPL2";
		if (_devCfgs.size() <= 1)
		{
			_devNames.push_back(chipName);
		}
		else
		{
			snprintf(chipNameFull, 0x10, "%s #%u", chipName, 1 + (unsigned int)curDev);
			_devNames.push_back(chipNameFull);
		}
	}
	
	return;
}